

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pMVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  float *pfVar9;
  Mat4 *a;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Mat4 shrinkScaleMat3d;
  Mat4 shrinkScaleMat2d;
  long local_128;
  undefined1 local_f8 [8];
  Vector<float,_2> VStack_f0;
  Vector<float,_2> local_e8;
  float afStack_e0 [10];
  undefined1 local_b8 [16];
  float local_a8 [14];
  Mat4 local_70;
  
  pfVar4 = (float *)local_b8;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_b8._0_4_ = 0.0;
  local_b8._4_4_ = 0.0;
  local_b8._8_4_ = 0.0;
  local_b8._12_4_ = 0.0;
  local_a8[4] = 0.0;
  pfVar5 = makeSafeLods::shrinkScaleMat2dData;
  lVar6 = 0;
  do {
    lVar10 = 0;
    pfVar9 = pfVar4;
    do {
      *pfVar9 = pfVar5[lVar10];
      lVar10 = lVar10 + 1;
      pfVar9 = pfVar9 + 3;
    } while (lVar10 != 3);
    lVar6 = lVar6 + 1;
    pfVar5 = pfVar5 + 3;
    pfVar4 = pfVar4 + 1;
  } while (lVar6 != 3);
  matExtend3To4(&local_70,(Mat3 *)local_b8);
  pfVar4 = (float *)local_f8;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  afStack_e0[0] = 0.0;
  afStack_e0[1] = 0.0;
  local_f8._0_4_ = 0.0;
  local_f8._4_4_ = 0.0;
  VStack_f0.m_data[0] = 0.0;
  VStack_f0.m_data[1] = 0.0;
  afStack_e0[2] = 0.0;
  pfVar5 = makeSafeLods::shrinkScaleMat3dData;
  lVar6 = 0;
  do {
    lVar10 = 0;
    pfVar9 = pfVar4;
    do {
      *pfVar9 = pfVar5[lVar10];
      lVar10 = lVar10 + 1;
      pfVar9 = pfVar9 + 3;
    } while (lVar10 != 3);
    lVar6 = lVar6 + 1;
    pfVar5 = pfVar5 + 3;
    pfVar4 = pfVar4 + 1;
  } while (lVar6 != 3);
  matExtend3To4((Mat4 *)local_b8,(Mat3 *)local_f8);
  if (*(int *)&(this->super_ShaderProgram).field_0x154 < 1) {
    return;
  }
  fVar19 = 1.0 / (float)viewportSize->m_data[0];
  fVar17 = 1.0 / (float)viewportSize->m_data[1];
  local_128 = 0;
  lVar6 = 0;
  do {
    while( true ) {
      pVVar1 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (textureSizes->
               super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar22 = pVVar1[lVar6].m_data[0].m_data[0] * (float)pVVar2[lVar6].m_data[0] * fVar19;
      fVar20 = (float)pVVar2[lVar6].m_data[0] * pVVar1[lVar6].m_data[0].m_data[1] * fVar17;
      fVar21 = pVVar1[lVar6].m_data[1].m_data[0] * (float)pVVar2[lVar6].m_data[1] * fVar19;
      fVar14 = (float)pVVar2[lVar6].m_data[1] * pVVar1[lVar6].m_data[1].m_data[1] * fVar17;
      fVar18 = pVVar1[lVar6].m_data[2].m_data[0] * (float)pVVar2[lVar6].m_data[2] * fVar19;
      fVar16 = (float)pVVar2[lVar6].m_data[2] * pVVar1[lVar6].m_data[2].m_data[1] * fVar17;
      fVar15 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar15 = fVar22;
      }
      fVar22 = -fVar20;
      if (-fVar20 <= fVar20) {
        fVar22 = fVar20;
      }
      fVar20 = -fVar21;
      if (-fVar21 <= fVar21) {
        fVar20 = fVar21;
      }
      fVar21 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar21 = fVar14;
      }
      fVar14 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar14 = fVar18;
      }
      fVar18 = -fVar16;
      if (-fVar16 <= fVar16) {
        fVar18 = fVar16;
      }
      fVar14 = logf((float)(~-(uint)(fVar21 <= fVar20) & (uint)fVar21 |
                           (uint)fVar20 & -(uint)(fVar21 <= fVar20)) +
                    (float)(~-(uint)(fVar22 <= fVar15) & (uint)fVar22 |
                           (uint)fVar15 & -(uint)(fVar22 <= fVar15)) +
                    (float)(~-(uint)(fVar18 <= fVar14) & (uint)fVar18 |
                           (uint)fVar14 & -(uint)(fVar18 <= fVar14)));
      fVar14 = fVar14 * 1.442695;
      pVVar1 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (textureSizes->
               super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      fVar23 = pVVar1[lVar6].m_data[0].m_data[0] * (float)pVVar2[lVar6].m_data[0] * fVar19;
      fVar18 = (float)pVVar2[lVar6].m_data[0] * pVVar1[lVar6].m_data[0].m_data[1] * fVar17;
      fVar22 = pVVar1[lVar6].m_data[1].m_data[0] * (float)pVVar2[lVar6].m_data[1] * fVar19;
      fVar20 = (float)pVVar2[lVar6].m_data[1] * pVVar1[lVar6].m_data[1].m_data[1] * fVar17;
      fVar21 = pVVar1[lVar6].m_data[2].m_data[0] * (float)pVVar2[lVar6].m_data[2] * fVar19;
      fVar16 = (float)pVVar2[lVar6].m_data[2] * pVVar1[lVar6].m_data[2].m_data[1] * fVar17;
      fVar15 = -fVar23;
      if (-fVar23 <= fVar23) {
        fVar15 = fVar23;
      }
      fVar23 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar23 = fVar18;
      }
      fVar18 = (float)(~-(uint)(fVar23 <= fVar15) & (uint)fVar23 |
                      (uint)fVar15 & -(uint)(fVar23 <= fVar15));
      fVar15 = -fVar22;
      if (-fVar22 <= fVar22) {
        fVar15 = fVar22;
      }
      fVar22 = -fVar20;
      if (-fVar20 <= fVar20) {
        fVar22 = fVar20;
      }
      fVar20 = (float)(~-(uint)(fVar22 <= fVar15) & (uint)fVar22 |
                      (uint)fVar15 & -(uint)(fVar22 <= fVar15));
      fVar15 = -fVar21;
      if (-fVar21 <= fVar21) {
        fVar15 = fVar21;
      }
      fVar21 = -fVar16;
      if (-fVar16 <= fVar16) {
        fVar21 = fVar16;
      }
      fVar15 = (float)(~-(uint)(fVar21 <= fVar15) & (uint)fVar21 |
                      (uint)fVar15 & -(uint)(fVar21 <= fVar15));
      uVar13 = -(uint)(fVar15 <= fVar20);
      fVar15 = (float)(~uVar13 & (uint)fVar15 | uVar13 & (uint)fVar20);
      uVar13 = -(uint)(fVar15 <= fVar18);
      fVar15 = logf((float)(uVar13 & (uint)fVar18 | ~uVar13 & (uint)fVar15));
      iVar8 = 0;
      iVar12 = 0;
      if (0.5 <= fVar14 + 0.01) {
        fVar16 = ceilf(fVar14 + 0.01 + 0.5);
        iVar12 = (int)fVar16 + -1;
      }
      fVar15 = fVar15 * 1.442695;
      if (0.5 <= fVar15 + -0.01) {
        fVar16 = ceilf(fVar15 + -0.01 + 0.5);
        iVar8 = (int)fVar16 + -1;
      }
      fVar16 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar16 = fVar14;
      }
      if (0.1 <= fVar16) break;
LAB_005814d3:
      a = &local_70;
      if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar6] == 0x806f) {
        a = (Matrix<float,_4,_4> *)local_b8;
      }
      pfVar4 = (float *)local_f8;
      tcu::operator*((Matrix<float,_4,_4> *)pfVar4,a,
                     (this->m_transformations).
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6);
      pMVar3 = (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(pMVar3->m_data).m_data[0].m_data + local_128;
      lVar7 = 0;
      do {
        lVar11 = 0;
        do {
          *(undefined4 *)(lVar10 + lVar11) = *(undefined4 *)((long)pfVar4 + lVar11);
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x40);
        lVar7 = lVar7 + 1;
        lVar10 = lVar10 + 4;
        pfVar4 = pfVar4 + 1;
      } while (lVar7 != 4);
      calculateLodDerivateParts((Vector<tcu::Vector<float,_2>,_3> *)local_f8,pMVar3 + lVar6);
      pVVar1 = (this->m_lodDerivateParts).
               super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *&pVVar1[lVar6].m_data[2].m_data = local_e8.m_data;
      pVVar1 = pVVar1 + lVar6;
      *(undefined1 (*) [8])pVVar1->m_data[0].m_data = local_f8;
      *&pVVar1->m_data[1].m_data = VStack_f0.m_data;
    }
    if (0.0 < fVar14) {
      fVar16 = floorf(fVar14);
      fVar16 = (fVar14 - fVar16) + -0.5;
      fVar14 = -fVar16;
      if (-fVar16 <= fVar16) {
        fVar14 = fVar16;
      }
      if (fVar14 < 0.1) goto LAB_005814d3;
    }
    fVar14 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar14 = fVar15;
    }
    if (fVar14 < 0.1) goto LAB_005814d3;
    if (0.0 < fVar15) {
      fVar14 = floorf(fVar15);
      fVar14 = (fVar15 - fVar14) + -0.5;
      fVar15 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar15 = fVar14;
      }
      if (fVar15 < 0.1) goto LAB_005814d3;
    }
    if (iVar12 != iVar8) goto LAB_005814d3;
    lVar6 = lVar6 + 1;
    local_128 = local_128 + 0x40;
    if (*(int *)&(this->super_ShaderProgram).field_0x154 <= lVar6) {
      return;
    }
  } while( true );
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec3>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMat2dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	static const float shrinkScaleMat3dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	0.95f
	};
	Mat4 shrinkScaleMat2d = matExtend3To4(Mat3(shrinkScaleMat2dData));
	Mat4 shrinkScaleMat3d = matExtend3To4(Mat3(shrinkScaleMat3dData));

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = (m_unitTypes[unitNdx] == GL_TEXTURE_3D ? shrinkScaleMat3d : shrinkScaleMat2d) * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}